

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>
                   (string *__return_storage_ptr__,char (*a) [24],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [67],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [93],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [19],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
                   char (*args_6) [14],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
                   char (*args_8) [19],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
                   char (*args_10) [13])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_440;
  cmAlphaNum local_408;
  cmAlphaNum local_3d0;
  cmAlphaNum local_398;
  cmAlphaNum local_360;
  cmAlphaNum local_328;
  cmAlphaNum local_2f0;
  cmAlphaNum local_2b8;
  cmAlphaNum local_280;
  cmAlphaNum local_248;
  cmAlphaNum local_210;
  cmAlphaNum local_1d8;
  cmAlphaNum local_1a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_168;
  string_view local_150;
  string *local_140;
  string_view local_138;
  string *local_128;
  string_view local_120;
  string *local_110;
  string_view local_108;
  string *local_f8;
  string_view local_f0;
  string *local_e0;
  string_view local_d8;
  string *local_c8;
  string_view local_c0;
  string *local_b0;
  string_view local_a8;
  string *local_98;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  cmAlphaNum::cmAlphaNum(&local_1a0,*a);
  local_168.first = cmAlphaNum::View(&local_1a0);
  local_168.second = local_1a0.RValueString_;
  local_1d8.RValueString_ = (string *)0x0;
  local_1d8.View_._M_str = (b->_M_dataplus)._M_p;
  local_1d8.View_._M_len = b->_M_string_length;
  local_150 = cmAlphaNum::View(&local_1d8);
  local_140 = local_1d8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_210,*args);
  local_138 = cmAlphaNum::View(&local_210);
  local_128 = local_210.RValueString_;
  local_248.RValueString_ = (string *)0x0;
  local_248.View_._M_str = (args_1->_M_dataplus)._M_p;
  local_248.View_._M_len = args_1->_M_string_length;
  local_120 = cmAlphaNum::View(&local_248);
  local_110 = local_248.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_280,*args_2);
  local_108 = cmAlphaNum::View(&local_280);
  local_f8 = local_280.RValueString_;
  local_2b8.RValueString_ = (string *)0x0;
  local_2b8.View_._M_str = (args_3->_M_dataplus)._M_p;
  local_2b8.View_._M_len = args_3->_M_string_length;
  local_f0 = cmAlphaNum::View(&local_2b8);
  local_e0 = local_2b8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_2f0,*args_4);
  local_d8 = cmAlphaNum::View(&local_2f0);
  local_c8 = local_2f0.RValueString_;
  local_328.RValueString_ = (string *)0x0;
  local_328.View_._M_str = (args_5->_M_dataplus)._M_p;
  local_328.View_._M_len = args_5->_M_string_length;
  local_c0 = cmAlphaNum::View(&local_328);
  local_b0 = local_328.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_360,*args_6);
  local_a8 = cmAlphaNum::View(&local_360);
  local_98 = local_360.RValueString_;
  local_398.RValueString_ = (string *)0x0;
  local_398.View_._M_str = (args_7->_M_dataplus)._M_p;
  local_398.View_._M_len = args_7->_M_string_length;
  local_90 = cmAlphaNum::View(&local_398);
  local_80 = local_398.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_3d0,*args_8);
  local_78 = cmAlphaNum::View(&local_3d0);
  local_68 = local_3d0.RValueString_;
  local_408.RValueString_ = (string *)0x0;
  local_408.View_._M_str = (args_9->_M_dataplus)._M_p;
  local_408.View_._M_len = args_9->_M_string_length;
  local_60 = cmAlphaNum::View(&local_408);
  local_50 = local_408.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_440,*args_10);
  local_48 = cmAlphaNum::View(&local_440);
  local_38 = local_440.RValueString_;
  views._M_len = 0xd;
  views._M_array = &local_168;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}